

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrix.hpp
# Opt level: O1

Matrix<double,_3,_2> * tcu::operator*(Matrix<double,_3,_1> *a,Matrix<double,_1,_2> *b)

{
  double dVar1;
  Vector<double,_3> *pVVar2;
  int row_1;
  long lVar3;
  Matrix<double,_3,_2> *res;
  Vector<double,_3> *in_RDI;
  Vector<double,_3> *pVVar4;
  int row;
  long lVar5;
  long lVar6;
  undefined8 uVar7;
  
  pVVar2 = in_RDI;
  *(undefined8 *)((long)(in_RDI + 1) + 8) = 0;
  *(undefined8 *)((long)(in_RDI + 1) + 0x10) = 0;
  in_RDI->m_data[2] = 0.0;
  in_RDI[1].m_data[0] = 0;
  in_RDI->m_data[0] = 0.0;
  in_RDI->m_data[1] = 0.0;
  lVar3 = 0;
  lVar5 = 0;
  pVVar4 = in_RDI;
  do {
    lVar6 = 0;
    do {
      uVar7 = 0x3ff0000000000000;
      if (lVar3 != lVar6) {
        uVar7 = 0;
      }
      *(undefined8 *)((long)pVVar4->m_data + lVar6) = uVar7;
      lVar6 = lVar6 + 0x18;
    } while (lVar6 == 0x18);
    lVar5 = lVar5 + 1;
    pVVar4 = (Vector<double,_3> *)(pVVar4->m_data + 1);
    lVar3 = lVar3 + 0x18;
  } while (lVar5 != 3);
  lVar3 = 0;
  do {
    dVar1 = (a->m_data).m_data[0].m_data[lVar3];
    lVar5 = 0;
    pVVar4 = in_RDI;
    do {
      ((Vector<tcu::Vector<double,_3>,_2> *)pVVar4->m_data)->m_data[0].m_data[0] =
           (b->m_data).m_data[lVar5].m_data[0] * dVar1 + 0.0;
      lVar5 = lVar5 + 1;
      pVVar4 = pVVar4 + 1;
    } while (lVar5 == 1);
    lVar3 = lVar3 + 1;
    in_RDI = (Vector<double,_3> *)(in_RDI->m_data + 1);
  } while (lVar3 != 3);
  return (Matrix<double,_3,_2> *)pVVar2;
}

Assistant:

Matrix<T, Rows0, Cols1> operator* (const Matrix<T, Rows0, Cols0>& a, const Matrix<T, Rows1, Cols1>& b)
{
	DE_STATIC_ASSERT(Cols0 == Rows1);
	Matrix<T, Rows0, Cols1> res;
	for (int row = 0; row < Rows0; row++)
	{
		for (int col = 0; col < Cols1; col++)
		{
			T v = T(0);
			for (int ndx = 0; ndx < Cols0; ndx++)
				v += a(row,ndx) * b(ndx,col);
			res(row,col) = v;
		}
	}
	return res;
}